

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

void QTest::setFailed(bool failed)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  byte in_DIL;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DIL & 1;
  if (setFailed(bool)::fatalFailure == '\0') {
    iVar3 = __cxa_guard_acquire(&setFailed(bool)::fatalFailure);
    if (iVar3 != 0) {
      setFailed::fatalFailure =
           setFailed::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      __cxa_guard_release(&setFailed(bool)::fatalFailure);
    }
  }
  if ((bVar2 != 0) && ((setFailed::fatalFailure & 1U) != 0)) {
    std::terminate();
  }
  Internal::failed = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setFailed(bool failed)
    {
        static const bool fatalFailure = []() {
            static const char * const environmentVar = "QTEST_FATAL_FAIL";
            if (!qEnvironmentVariableIsSet(environmentVar))
                return false;

            bool ok;
            const int fatal = qEnvironmentVariableIntValue(environmentVar, &ok);
            return ok && fatal;
        }();

        if (failed && fatalFailure)
            std::terminate();
        Internal::failed = failed;
    }